

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_array_slice(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int splice)

{
  int iVar1;
  BOOL BVar2;
  JSValueUnion JVar3;
  int64_t *piVar4;
  ulong uVar5;
  JSObject *p;
  ulong uVar6;
  int64_t iVar7;
  JSValueUnion JVar8;
  uint32_t *puVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  JSValue v;
  JSValue obj;
  JSValue JVar13;
  JSValue JVar14;
  JSValue len_val;
  JSValue val_00;
  JSValue val_01;
  JSValue val_02;
  JSValue val_03;
  long local_a8;
  ulong local_88;
  int64_t start;
  uint32_t count32;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  JSValue *local_58;
  JSValue *arrp;
  int64_t len;
  JSValue val;
  uint32_t *countp;
  
  uVar11 = (ulong)(uint)argc;
  JVar13 = JS_ToObject(ctx,this_val);
  iVar1 = js_get_length64(ctx,&len,JVar13);
  if ((iVar1 != 0) || (iVar1 = JS_ToInt64Clamp(ctx,&start,*argv,0,len,len), iVar1 != 0)) {
LAB_0015536f:
    uVar11 = 0;
    JVar14 = (JSValue)(ZEXT816(3) << 0x40);
    goto LAB_00155376;
  }
  if (splice == 0) {
    local_88 = len;
    if ((int)argv[1].tag != 3) {
      JVar14.tag = argv[1].tag;
      JVar14.u.ptr = argv[1].u.ptr;
      iVar1 = JS_ToInt64Clamp(ctx,(int64_t *)&local_88,JVar14,0,len,len);
      uVar11 = 0;
      JVar14 = (JSValue)(ZEXT816(3) << 0x40);
      if (iVar1 != 0) goto LAB_00155376;
    }
    uVar11 = 0;
    uVar6 = local_88 - start;
    if ((long)(local_88 - start) < 1) {
      uVar6 = uVar11;
    }
  }
  else {
    if (argc == 0) {
      local_68 = 0;
    }
    else if (argc == 1) {
      uVar11 = 0;
      local_68 = len - start;
    }
    else {
      iVar1 = JS_ToInt64Clamp(ctx,(int64_t *)&local_88,argv[1],0,len - start,0);
      if (iVar1 != 0) goto LAB_0015536f;
      uVar11 = (ulong)(argc - 2);
      local_68 = local_88;
    }
    uVar6 = local_68;
    if (0x1fffffffffffff < (long)((uVar11 + len) - local_68)) {
      JS_ThrowTypeError(ctx,"Array loo long");
      uVar11 = 0;
      JVar14 = (JSValue)(ZEXT816(3) << 0x40);
      goto LAB_00155376;
    }
  }
  bVar12 = (long)(int)uVar6 == uVar6;
  JVar8.float64 = (double)(long)uVar6;
  if (bVar12) {
    JVar8.ptr = (void *)(uVar6 & 0xffffffff);
  }
  puVar9 = (uint32_t *)0x0;
  if (!bVar12) {
    puVar9 = (uint32_t *)0x7;
  }
  len_val.tag = (int64_t)puVar9;
  len_val.u.float64 = JVar8.float64;
  countp = puVar9;
  local_60 = uVar11;
  local_58 = argv;
  JVar14 = JS_ArraySpeciesCreate(ctx,JVar13,len_val);
  JVar3 = JVar14.u;
  uVar11 = (ulong)JVar3.ptr >> 0x20;
  v.tag = (int64_t)puVar9;
  v.u.float64 = JVar8.float64;
  JS_FreeValue(ctx,v);
  if ((JVar14.tag & 0xffffffffU) == 6) goto LAB_00155376;
  uVar6 = uVar6 + start;
  obj.tag = (int64_t)&arrp;
  obj.u = (JSValueUnion)(JSValueUnion)JVar13.tag;
  BVar2 = js_get_fast_array((JSContext *)JVar13.u.ptr,obj,(JSValue **)&count32,countp);
  local_a8 = start;
  lVar10 = start;
  if (BVar2 == 0) {
LAB_00155645:
    JVar8.float64 = 0.0;
  }
  else if ((int)JVar14.tag == -1) {
    if ((*(short *)((long)JVar3.ptr + 6) != 2) || ((*(byte *)((long)JVar3.ptr + 5) & 8) == 0))
    goto LAB_00155645;
    local_70 = (ulong)count32;
    if ((long)uVar6 < (long)(ulong)count32) {
      local_70 = uVar6;
    }
    piVar4 = &arrp[start].tag;
    for (JVar8.float64 = 0.0; lVar10 = start + (long)JVar8.ptr,
        start + (long)JVar8.ptr < (long)local_70; JVar8.float64 = JVar8.float64 + 1) {
      JVar3 = (JSValueUnion)((JSValueUnion *)(piVar4 + -1))->ptr;
      iVar7 = *piVar4;
      if (0xfffffff4 < (uint)iVar7) {
        *(int *)JVar3.ptr = *JVar3.ptr + 1;
      }
      val_00.tag = iVar7;
      val_00.u.ptr = JVar3.ptr;
      iVar1 = JS_CreateDataPropertyUint32(ctx,JVar14,(int64_t)JVar8,val_00,0x4000);
      if (iVar1 < 0) goto LAB_00155376;
      piVar4 = piVar4 + 2;
    }
  }
  else {
    JVar8.float64 = 0.0;
  }
  for (; lVar10 < (long)uVar6; lVar10 = lVar10 + 1) {
    iVar1 = JS_TryGetPropertyInt64(ctx,JVar13,lVar10,&val);
    if ((iVar1 < 0) ||
       ((iVar1 != 0 &&
        (iVar1 = JS_CreateDataPropertyUint32(ctx,JVar14,(int64_t)JVar8,val,0x4000), iVar1 < 0))))
    goto LAB_00155376;
    JVar8.float64 = JVar8.float64 + 1;
  }
  uVar6 = (ulong)JVar8.ptr >> 0x1f;
  JVar3.float64 = (double)JVar8.float64;
  if (uVar6 == 0) {
    JVar3 = JVar8;
  }
  if (uVar6 != 0) {
    uVar6 = 7;
  }
  val_01.tag = uVar6;
  val_01.u.float64 = JVar3.float64;
  iVar1 = JS_SetProperty(ctx,JVar14,0x30,val_01);
  if (-1 < iVar1) {
    if (splice == 0) {
LAB_0015584d:
      JS_FreeValue(ctx,JVar13);
      return JVar14;
    }
    uVar5 = local_60 & 0xffffffff;
    uVar6 = (len + uVar5) - local_68;
    if (local_68 == uVar5) {
LAB_0015572b:
      lVar10 = 0;
      do {
        if (uVar5 << 4 == lVar10) {
          bVar12 = (long)(int)uVar6 == uVar6;
          JVar8.float64 = (double)(long)uVar6;
          if (bVar12) {
            JVar8.ptr = (void *)(uVar6 & 0xffffffff);
          }
          iVar7 = 7;
          if (bVar12) {
            iVar7 = 0;
          }
          val_03.tag = iVar7;
          val_03.u.float64 = JVar8.float64;
          iVar1 = JS_SetProperty(ctx,JVar13,0x30,val_03);
          if (-1 < iVar1) goto LAB_0015584d;
          break;
        }
        JVar8 = (JSValueUnion)((JSValueUnion *)((long)&local_58[2].u + lVar10))->ptr;
        iVar7 = *(int64_t *)((long)&local_58[2].tag + lVar10);
        if (0xfffffff4 < (uint)iVar7) {
          *(int *)JVar8.ptr = *JVar8.ptr + 1;
        }
        val_02.tag = iVar7;
        val_02.u.ptr = JVar8.ptr;
        iVar1 = JS_SetPropertyInt64(ctx,JVar13,local_a8,val_02);
        lVar10 = lVar10 + 0x10;
        local_a8 = local_a8 + 1;
      } while (-1 < iVar1);
    }
    else {
      iVar1 = JS_CopySubArray(ctx,JVar13,start + uVar5,local_68 + start,len - (local_68 + start),
                              (((long)uVar5 <= (long)local_68) - 1) +
                              (uint)((long)uVar5 <= (long)local_68));
      while (-1 < iVar1) {
        if (len <= (long)uVar6) goto LAB_0015572b;
        len = len + -1;
        iVar1 = JS_DeletePropertyInt64(ctx,JVar13,len,0x4000);
      }
    }
  }
LAB_00155376:
  JS_FreeValue(ctx,JVar13);
  JVar13.u.ptr = (void *)((ulong)JVar14.u.ptr & 0xffffffff | uVar11 << 0x20);
  JVar13.tag = JVar14.tag;
  JS_FreeValue(ctx,JVar13);
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_array_slice(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv, int splice)
{
    JSValue obj, arr, val, len_val;
    int64_t len, start, k, final, n, count, del_count, new_len;
    int kPresent;
    JSValue *arrp;
    uint32_t count32, i, item_count;

    arr = JS_UNDEFINED;
    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &len, obj))
        goto exception;

    if (JS_ToInt64Clamp(ctx, &start, argv[0], 0, len, len))
        goto exception;

    if (splice) {
        if (argc == 0) {
            item_count = 0;
            del_count = 0;
        } else
        if (argc == 1) {
            item_count = 0;
            del_count = len - start;
        } else {
            item_count = argc - 2;
            if (JS_ToInt64Clamp(ctx, &del_count, argv[1], 0, len - start, 0))
                goto exception;
        }
        if (len + item_count - del_count > MAX_SAFE_INTEGER) {
            JS_ThrowTypeError(ctx, "Array loo long");
            goto exception;
        }
        count = del_count;
    } else {
        item_count = 0; /* avoid warning */
        final = len;
        if (!JS_IsUndefined(argv[1])) {
            if (JS_ToInt64Clamp(ctx, &final, argv[1], 0, len, len))
                goto exception;
        }
        count = max_int64(final - start, 0);
    }
    len_val = JS_NewInt64(ctx, count);
    arr = JS_ArraySpeciesCreate(ctx, obj, len_val);
    JS_FreeValue(ctx, len_val);
    if (JS_IsException(arr))
        goto exception;

    k = start;
    final = start + count;
    n = 0;
    /* The fast array test on arr ensures that
       JS_CreateDataPropertyUint32() won't modify obj in case arr is
       an exotic object */
    /* Special case fast arrays */
    if (js_get_fast_array(ctx, obj, &arrp, &count32) &&
        js_is_fast_array(ctx, arr)) {
        /* XXX: should share code with fast array constructor */
        for (; k < final && k < count32; k++, n++) {
            if (JS_CreateDataPropertyUint32(ctx, arr, n, JS_DupValue(ctx, arrp[k]), JS_PROP_THROW) < 0)
                goto exception;
        }
    }
    /* Copy the remaining elements if any (handle case of inherited properties) */
    for (; k < final; k++, n++) {
        kPresent = JS_TryGetPropertyInt64(ctx, obj, k, &val);
        if (kPresent < 0)
            goto exception;
        if (kPresent) {
            if (JS_CreateDataPropertyUint32(ctx, arr, n, val, JS_PROP_THROW) < 0)
                goto exception;
        }
    }
    if (JS_SetProperty(ctx, arr, JS_ATOM_length, JS_NewInt64(ctx, n)) < 0)
        goto exception;

    if (splice) {
        new_len = len + item_count - del_count;
        if (item_count != del_count) {
            if (JS_CopySubArray(ctx, obj, start + item_count,
                                start + del_count, len - (start + del_count),
                                item_count <= del_count ? +1 : -1) < 0)
                goto exception;

            for (k = len; k-- > new_len; ) {
                if (JS_DeletePropertyInt64(ctx, obj, k, JS_PROP_THROW) < 0)
                    goto exception;
            }
        }
        for (i = 0; i < item_count; i++) {
            if (JS_SetPropertyInt64(ctx, obj, start + i, JS_DupValue(ctx, argv[i + 2])) < 0)
                goto exception;
        }
        if (JS_SetProperty(ctx, obj, JS_ATOM_length, JS_NewInt64(ctx, new_len)) < 0)
            goto exception;
    }
    JS_FreeValue(ctx, obj);
    return arr;

 exception:
    JS_FreeValue(ctx, obj);
    JS_FreeValue(ctx, arr);
    return JS_EXCEPTION;
}